

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int proto_eq(MIR_item_t pi1,MIR_item_t pi2,void *arg)

{
  ulong uVar1;
  MIR_type_t *pMVar2;
  MIR_proto_t pMVar3;
  VARR_MIR_var_t *pVVar4;
  node_t_conflict pnVar5;
  gen_ctx_conflict *pgVar6;
  VARR_MIR_type_t *pVVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  MIR_type_t MVar11;
  MIR_var_t *extraout_RAX;
  MIR_var_t *pMVar12;
  mir_size_t mVar13;
  c2m_ctx_t pcVar14;
  ulong uVar15;
  MIR_type_t MVar16;
  char *suffix;
  MIR_type_t promoted_type;
  MIR_item_t pMVar17;
  c2m_ctx_t pcVar18;
  c2m_ctx_t pcVar19;
  ulong uVar20;
  node_t_conflict pnVar21;
  ulong uVar22;
  char *pcVar23;
  long lVar24;
  size_t sVar25;
  int *piVar26;
  target_arg_info_t tStack_88;
  gen_ctx_conflict *pgStack_80;
  MIR_type_t aMStack_78 [2];
  c2m_ctx_t pcStack_70;
  bool local_34;
  
  pcVar18 = (c2m_ctx_t)(pi1->u).proto;
  pMVar3 = (pi2->u).proto;
  uVar10 = *(uint *)&pcVar18->options;
  if ((uVar10 != pMVar3->nres) || (*(char *)(pcVar18->env[0].__jmpbuf + 1) != pMVar3->vararg_p)) {
    return 0;
  }
  pVVar4 = (VARR_MIR_var_t *)pcVar18->env[0].__jmpbuf[2];
  if (pVVar4 == (VARR_MIR_var_t *)0x0) {
    proto_eq_cold_2();
  }
  else {
    pi2 = (MIR_item_t)pMVar3->args;
    if (pi2 != (MIR_item_t)0x0) {
      pnVar5 = (node_t_conflict)pVVar4->els_num;
      if (pnVar5 != (node_t_conflict)pi2->data) {
        return 0;
      }
      if ((ulong)uVar10 != 0) {
        uVar20 = 0;
        do {
          if (((MIR_type_t *)pcVar18->env[0].__jmpbuf[0])[uVar20] != pMVar3->res_types[uVar20]) {
            return 0;
          }
          uVar20 = uVar20 + 1;
        } while (uVar10 != uVar20);
      }
      if (pnVar5 == (node_t_conflict)0x0) {
        return 1;
      }
      pMVar12 = pVVar4->varr;
      pMVar17 = (pi2->item_link).prev;
      MVar11 = pMVar12->type;
      if (MVar11 != *(MIR_type_t *)&pMVar17->data) {
        return 0;
      }
      pnVar21 = (node_t_conflict)0x1;
      local_34 = false;
      lVar24 = 0x18;
      do {
        iVar9 = strcmp(*(char **)((long)pMVar12 + lVar24 + -0x10),
                       *(char **)((long)pMVar17 + lVar24 + -0x10));
        if ((iVar9 != 0) ||
           (((0xfffffff9 < MVar11 - MIR_T_UNDEF &&
             (*(long *)((long)pMVar12 + lVar24 + -8) != *(long *)((long)pMVar17 + lVar24 + -8))) ||
            (local_34 = pnVar5 <= pnVar21, pnVar21 == pnVar5)))) break;
        MVar11 = *(MIR_type_t *)((long)&pMVar12->type + lVar24);
        pnVar21 = (node_t_conflict)((long)&pnVar21->code + 1);
        pMVar2 = (MIR_type_t *)((long)&pMVar17->data + lVar24);
        lVar24 = lVar24 + 0x18;
      } while (MVar11 == *pMVar2);
      return (uint)local_34;
    }
  }
  proto_eq_cold_1();
  pgVar6 = pcVar18->gen_ctx;
  pVVar4 = (pgVar6->proto_info).arg_vars;
  pgStack_80 = pgVar6;
  if ((pVVar4 == (VARR_MIR_var_t *)0x0) || (pVVar4->varr == (MIR_var_t *)0x0)) {
LAB_0019a7a6:
    collect_args_and_func_types_cold_6();
LAB_0019a7ab:
    collect_args_and_func_types_cold_5();
  }
  else {
    piVar26 = *(int **)&((pi2->item_link).prev)->item_type;
    pVVar4->els_num = 0;
    pVVar7 = (pgVar6->proto_info).ret_types;
    if ((pVVar7 == (VARR_MIR_type_t *)0x0) || (pVVar7->varr == (MIR_type_t *)0x0))
    goto LAB_0019a7ab;
    pVVar7->els_num = 0;
    (pgVar6->proto_info).res_ref_p = 0;
    tStack_88.n_iregs = 0;
    tStack_88.n_fregs = 0;
    set_type_layout(pcVar18,(type *)pi2->module);
    pi2 = (MIR_item_t)pi2->module;
    pVVar7 = (pgVar6->proto_info).ret_types;
    pVVar4 = (pgVar6->proto_info).arg_vars;
    pcVar19 = pcVar18;
    pcStack_70 = pcVar18;
    if ((*(type_mode *)&(pi2->item_link).next == TM_BASIC) &&
       (pMVar12 = extraout_RAX, ((anon_union_8_5_3fbb1736_for_u *)&pi2->addr)->basic_type == TP_VOID
       )) {
LAB_0019a5e3:
      if ((piVar26 != (int *)0x0) &&
         (((*piVar26 != 0x7b ||
           (pMVar12 = *(MIR_var_t **)(*(long *)(piVar26 + 2) + 0x18), pMVar12[1].type != MIR_T_U8))
          || (pMVar12[2].type != MIR_T_U8)))) {
        do {
          if (*piVar26 == 0x7b) {
            pcVar23 = "p";
            pi2 = *(MIR_item_t *)(*(long *)(piVar26 + 2) + 0x18);
          }
          else {
            if (((*(long *)(piVar26 + 8) == 0) || (*piVar26 != 0x55)) ||
               ((piVar8 = *(int **)(*(long *)(piVar26 + 8) + 0x18), piVar8 == (int *)0x0 ||
                (*piVar8 != 0x5d)))) {
              __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x2c94,
                            "void collect_args_and_func_types(c2m_ctx_t, struct func_type *)");
            }
            pi2 = *(MIR_item_t *)(*(long *)(piVar26 + 2) + 0x40);
            pcVar23 = get_param_name(pcVar19,(type *)pi2,*(char **)(*(long *)(piVar8 + 8) + 0x20));
          }
          pVVar4 = (pgStack_80->proto_info).arg_vars;
          iVar9 = process_aggregate_arg(pcVar19,(type *)pi2,&tStack_88,aMStack_78);
          if (((ulong)(pi2->item_link).next & 0xfffffffe) == 4) {
            MVar16 = get_blk_type(iVar9,aMStack_78);
            pMVar17 = pi2;
            pcVar14 = (c2m_ctx_t)raw_type_size(pcVar19,(type *)pi2);
            uVar20 = (ulong)(int)pi2->item_type;
            pi2 = pMVar17;
            pcVar18 = pcVar19;
            if (uVar20 != 0) {
              uVar22 = (long)pcVar14->env[0].__jmpbuf + (uVar20 - 0x11);
              pcVar14 = (c2m_ctx_t)(uVar22 - uVar22 % uVar20);
            }
          }
          else {
            pcVar18 = pcVar19;
            MVar11 = get_mir_type(pcVar19,(type *)pi2);
            pcVar14 = pcVar19;
            if ((MVar11 & 0x1e) == MIR_T_F) {
              tStack_88.n_fregs = tStack_88.n_fregs + 1;
              MVar16 = MVar11;
            }
            else {
              MVar16 = MIR_T_LD;
              if (MVar11 != MIR_T_LD) {
                tStack_88.n_iregs = tStack_88.n_iregs + 1;
                MVar16 = MVar11;
              }
            }
          }
          pMVar12 = pVVar4->varr;
          if (pMVar12 == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019a7a1:
            collect_args_and_func_types_cold_1();
            goto LAB_0019a7a6;
          }
          sVar25 = pVVar4->els_num;
          uVar20 = sVar25 + 1;
          if (pVVar4->size < uVar20) {
            sVar25 = (uVar20 >> 1) + uVar20;
            pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar25 * 0x18);
            pVVar4->varr = pMVar12;
            pVVar4->size = sVar25;
            sVar25 = pVVar4->els_num;
            uVar20 = sVar25 + 1;
          }
          pVVar4->els_num = uVar20;
          pMVar12[sVar25].type = MVar16;
          pMVar12[sVar25].name = pcVar23;
          pMVar12[sVar25].size = (size_t)pcVar14;
          piVar26 = *(int **)(piVar26 + 6);
          pcVar19 = pcStack_70;
        } while (piVar26 != (int *)0x0);
      }
      return (int)pMVar12;
    }
    uVar10 = process_ret_type(pcVar18,(type *)pi2,aMStack_78);
    pMVar12 = (MIR_var_t *)(ulong)uVar10;
    if (uVar10 != 0) {
      if (0 < (int)uVar10) {
        uVar20 = pVVar7->els_num;
        pMVar12 = (MIR_var_t *)pVVar7->varr;
        uVar22 = 0;
        do {
          pcVar18 = (c2m_ctx_t)0x4;
          pi2 = (MIR_item_t)0x5;
          MVar11 = aMStack_78[uVar22];
          MVar16 = MVar11 & ~MIR_T_I16;
          if (MVar16 == MIR_T_U8) {
            MVar11 = MIR_T_U32;
          }
          if (MVar16 == MIR_T_I8) {
            MVar11 = MIR_T_I32;
          }
          if (pMVar12 == (MIR_var_t *)0x0) goto LAB_0019a7a1;
          uVar1 = uVar20 + 1;
          uVar15 = uVar20;
          uVar20 = uVar1;
          if (pVVar7->size < uVar1) {
            sVar25 = (uVar1 >> 1) + uVar1;
            pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar25 * 4);
            pVVar7->varr = (MIR_type_t *)pMVar12;
            pVVar7->size = sVar25;
            uVar15 = pVVar7->els_num;
            uVar20 = uVar15 + 1;
            pcVar19 = pcStack_70;
          }
          uVar22 = uVar22 + 1;
          pVVar7->els_num = uVar20;
          (&pMVar12->type)[uVar15] = MVar11;
        } while (uVar10 != uVar22);
      }
      goto LAB_0019a5e3;
    }
    if (((ulong)(pi2->item_link).next & 0xfffffffe) != 4) {
      MVar11 = get_mir_type(pcVar18,(type *)pi2);
      pMVar12 = (MIR_var_t *)pVVar7->varr;
      if (pMVar12 != (MIR_var_t *)0x0) {
        sVar25 = pVVar7->els_num;
        uVar20 = sVar25 + 1;
        if (pVVar7->size < uVar20) {
          sVar25 = (uVar20 >> 1) + uVar20;
          pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar25 * 4);
          pVVar7->varr = (MIR_type_t *)pMVar12;
          pVVar7->size = sVar25;
          sVar25 = pVVar7->els_num;
          uVar20 = sVar25 + 1;
        }
        pVVar7->els_num = uVar20;
        (&pMVar12->type)[sVar25] = MVar11;
        goto LAB_0019a5e3;
      }
      goto LAB_0019a7b5;
    }
    pMVar17 = pi2;
    mVar13 = raw_type_size(pcVar18,(type *)pi2);
    uVar20 = (ulong)(int)pi2->item_type;
    if (uVar20 != 0) {
      uVar22 = (mVar13 - 1) + uVar20;
      mVar13 = uVar22 - uVar22 % uVar20;
    }
    pMVar12 = pVVar4->varr;
    pi2 = pMVar17;
    if (pMVar12 != (MIR_var_t *)0x0) {
      sVar25 = pVVar4->els_num;
      uVar20 = sVar25 + 1;
      if (pVVar4->size < uVar20) {
        sVar25 = (uVar20 >> 1) + uVar20;
        pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar25 * 0x18);
        pVVar4->varr = pMVar12;
        pVVar4->size = sVar25;
        sVar25 = pVVar4->els_num;
        uVar20 = sVar25 + 1;
      }
      pVVar4->els_num = uVar20;
      pMVar12[sVar25].type = MIR_T_RBLK;
      pMVar12[sVar25].name = "Ret_Addr";
      pMVar12[sVar25].size = mVar13;
      tStack_88.n_iregs = 1;
      goto LAB_0019a5e3;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019a7b5:
  collect_args_and_func_types_cold_2();
  if (pcVar18 != (c2m_ctx_t)0x0) {
    return (int)pcVar18->env[0].__jmpbuf[0];
  }
  VARR_MIR_var_taddr_cold_1();
  if (pcVar18 != (c2m_ctx_t)0x0) {
    return (int)pcVar18->ctx;
  }
  VARR_MIR_var_tlength_cold_1();
  MVar11 = MIR_T_I64;
  if (((ulong)(pi2->item_link).next & 0xfffffffe) != 4) {
    MVar11 = get_mir_type(pcVar18,(type *)pi2);
  }
  MVar16 = MIR_T_U32;
  if ((MVar11 & 0x1d) != MIR_T_U8) {
    MVar16 = MVar11;
  }
  promoted_type = MIR_T_I32;
  if ((MVar11 & 0x1d) != MIR_T_I8) {
    promoted_type = MVar16;
  }
  pcVar23 = get_reg_var_name(pcVar18,promoted_type,suffix,0);
  return (int)pcVar23;
}

Assistant:

static int proto_eq (MIR_item_t pi1, MIR_item_t pi2, void *arg MIR_UNUSED) {
  MIR_proto_t p1 = pi1->u.proto, p2 = pi2->u.proto;

  if (p1->nres != p2->nres || p1->vararg_p != p2->vararg_p
      || VARR_LENGTH (MIR_var_t, p1->args) != VARR_LENGTH (MIR_var_t, p2->args))
    return FALSE;
  for (uint32_t i = 0; i < p1->nres; i++)
    if (p1->res_types[i] != p2->res_types[i]) return FALSE;

  MIR_var_t *args1 = VARR_ADDR (MIR_var_t, p1->args), *args2 = VARR_ADDR (MIR_var_t, p2->args);

  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p1->args); i++)
    if (args1[i].type != args2[i].type || strcmp (args1[i].name, args2[i].name) != 0
        || (MIR_all_blk_type_p (args1[i].type) && args1[i].size != args2[i].size))
      return FALSE;
  return TRUE;
}